

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_atan_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  unkuint10 Var3;
  unkuint10 Var4;
  unkuint10 Var5;
  flag zSign;
  int32_t aExp_00;
  uint uVar6;
  int iVar7;
  uint64_t uVar8;
  ushort uVar9;
  uint16_t uVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  floatx80 fVar11;
  floatx80 fVar12;
  floatx80 fVar13;
  floatx80 fVar14;
  floatx80 fVar15;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 a_14;
  floatx80 a_15;
  floatx80 a_16;
  floatx80 a_17;
  floatx80 a_18;
  floatx80 a_19;
  floatx80 a_20;
  floatx80 a_21;
  floatx80 a_22;
  floatx80 a_23;
  floatx80 a_24;
  floatx80 a_25;
  floatx80 a_26;
  floatx80 a_27;
  floatx80 a_28;
  floatx80 a_29;
  floatx80 a_30;
  floatx80 a_31;
  floatx80 a_32;
  floatx80 a_33;
  floatx80 a_34;
  floatx80 a_35;
  floatx80 a_36;
  floatx80 a_37;
  floatx80 a_38;
  floatx80 a_39;
  floatx80 a_40;
  floatx80 a_41;
  floatx80 a_42;
  floatx80 a_43;
  floatx80 a_44;
  floatx80 a_45;
  floatx80 a_46;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 b_05;
  floatx80 b_06;
  floatx80 b_07;
  floatx80 b_08;
  floatx80 b_09;
  floatx80 b_10;
  floatx80 b_11;
  floatx80 b_12;
  floatx80 b_13;
  floatx80 b_14;
  floatx80 b_15;
  floatx80 b_16;
  floatx80 b_17;
  floatx80 b_18;
  floatx80 b_19;
  floatx80 b_20;
  floatx80 b_21;
  floatx80 b_22;
  floatx80 b_23;
  floatx80 b_24;
  floatx80 b_25;
  floatx80 b_26;
  floatx80 b_27;
  floatx80 b_28;
  floatx80 b_29;
  floatx80 b_30;
  floatx80 b_31;
  floatx80 b_32;
  floatx80 b_33;
  floatx80 b_34;
  floatx80 b_35;
  floatx80 b_36;
  floatx80 b_37;
  floatx80 b_38;
  floatx80 b_39;
  floatx80 b_40;
  floatx80 b_41;
  floatx80 b_42;
  floatx80 xsave;
  floatx80 fp3;
  floatx80 fp2;
  floatx80 fp1;
  floatx80 fp0;
  int32_t tbl_index;
  int32_t compact;
  int8_t user_rnd_prec;
  int8_t user_rnd_mode;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  Var4 = a._0_10_;
  fVar12._10_6_ = 0;
  fVar12.low = (long)Var4;
  fVar12.high = (short)(Var4 >> 0x40);
  uVar8 = extractFloatx80Frac(fVar12);
  fVar13._10_6_ = 0;
  fVar13.low = (long)Var4;
  fVar13.high = (short)(Var4 >> 0x40);
  aExp_00 = extractFloatx80Exp(fVar13);
  fVar14._10_6_ = 0;
  fVar14.low = (long)Var4;
  fVar14.high = (short)(Var4 >> 0x40);
  zSign = extractFloatx80Sign(fVar14);
  if (aExp_00 == 0x7fff) {
    if ((uVar8 & 0x7fffffffffffffff) == 0) {
      fVar12 = packFloatx80(zSign,0x3fff,0xc90fdaa22168c235);
      float_raise_m68k(' ',status);
      a_01._10_6_ = 0;
      a_01.low = (long)fVar12._0_10_;
      a_01.high = (short)(fVar12._0_10_ >> 0x40);
      fVar11 = floatx80_move_m68k(a_01,status);
      uVar10 = fVar11.high;
    }
    else {
      a_00._10_6_ = 0;
      a_00.low = (long)Var4;
      a_00.high = (short)(Var4 >> 0x40);
      fVar11 = propagateFloatx80NaNOneArg(a_00,status);
      uVar10 = fVar11.high;
    }
  }
  else if ((aExp_00 == 0) && (uVar8 == 0)) {
    fVar11 = packFloatx80(zSign,0,0);
    uVar10 = fVar11.high;
  }
  else {
    uVar6 = floatx80_make_compact(aExp_00,uVar8);
    cVar1 = status->float_rounding_mode;
    cVar2 = status->floatx80_rounding_precision;
    status->float_rounding_mode = '\0';
    status->floatx80_rounding_precision = 'P';
    if (((int)uVar6 < 0x3ffb8000) || (0x4002ffff < (int)uVar6)) {
      if ((int)uVar6 < 0x3fff8001) {
        if ((int)uVar6 < 0x3fd78000) {
          status->float_rounding_mode = cVar1;
          status->floatx80_rounding_precision = cVar2;
          a_18._10_6_ = 0;
          a_18.low = (long)Var4;
          a_18.high = (short)(Var4 >> 0x40);
          fVar12 = floatx80_move_m68k(a_18,status);
          uVar10 = fVar12.high;
          float_raise_m68k(' ',status);
          fVar11._8_8_ = extraout_RDX_01;
          fVar11.low = fVar12.low;
        }
        else {
          a_19._10_6_ = 0;
          a_19.low = (long)Var4;
          a_19.high = (short)(Var4 >> 0x40);
          b_15._10_6_ = 0;
          b_15.low = (long)Var4;
          b_15.high = (short)(Var4 >> 0x40);
          fVar12 = floatx80_mul_m68k(a_19,b_15,status);
          Var5 = fVar12._0_10_;
          a_20._10_6_ = 0;
          a_20.low = (long)Var5;
          a_20.high = (short)(Var5 >> 0x40);
          b_16._10_6_ = 0;
          b_16.low = (long)Var5;
          b_16.high = (short)(Var5 >> 0x40);
          fVar12 = floatx80_mul_m68k(a_20,b_16,status);
          fVar13 = float64_to_floatx80_m68k(0x3fb344447f876989,status);
          fVar14 = float64_to_floatx80_m68k(0xbfb744ee7faf45db,status);
          Var3 = fVar12._0_10_;
          a_21._10_6_ = 0;
          a_21.low = (long)fVar13._0_10_;
          a_21.high = (short)(fVar13._0_10_ >> 0x40);
          b_17._10_6_ = 0;
          b_17.low = (long)Var3;
          b_17.high = (short)(Var3 >> 0x40);
          fVar12 = floatx80_mul_m68k(a_21,b_17,status);
          a_22._10_6_ = 0;
          a_22.low = (long)fVar14._0_10_;
          a_22.high = (short)(fVar14._0_10_ >> 0x40);
          b_18._10_6_ = 0;
          b_18.low = (long)Var3;
          b_18.high = (short)(Var3 >> 0x40);
          fVar13 = floatx80_mul_m68k(a_22,b_18,status);
          fVar14 = float64_to_floatx80_m68k(0x3fbc71c646940220,status);
          a_23._10_6_ = 0;
          a_23.low = (long)fVar12._0_10_;
          a_23.high = (short)(fVar12._0_10_ >> 0x40);
          b_19._10_6_ = 0;
          b_19.low = (long)fVar14._0_10_;
          b_19.high = (short)(fVar14._0_10_ >> 0x40);
          fVar12 = floatx80_add_m68k(a_23,b_19,status);
          fVar14 = float64_to_floatx80_m68k(0xbfc24924921872f9,status);
          a_24._10_6_ = 0;
          a_24.low = (long)fVar13._0_10_;
          a_24.high = (short)(fVar13._0_10_ >> 0x40);
          b_20._10_6_ = 0;
          b_20.low = (long)fVar14._0_10_;
          b_20.high = (short)(fVar14._0_10_ >> 0x40);
          fVar13 = floatx80_add_m68k(a_24,b_20,status);
          a_25._10_6_ = 0;
          a_25.low = (long)fVar12._0_10_;
          a_25.high = (short)(fVar12._0_10_ >> 0x40);
          b_21._10_6_ = 0;
          b_21.low = (long)Var3;
          b_21.high = (short)(Var3 >> 0x40);
          fVar12 = floatx80_mul_m68k(a_25,b_21,status);
          a_26._10_6_ = 0;
          a_26.low = (long)Var3;
          a_26.high = (short)(Var3 >> 0x40);
          b_22._10_6_ = 0;
          b_22.low = (long)fVar13._0_10_;
          b_22.high = (short)(fVar13._0_10_ >> 0x40);
          fVar13 = floatx80_mul_m68k(a_26,b_22,status);
          fVar14 = float64_to_floatx80_m68k(0x3fc9999999998fa9,status);
          a_27._10_6_ = 0;
          a_27.low = (long)fVar12._0_10_;
          a_27.high = (short)(fVar12._0_10_ >> 0x40);
          b_23._10_6_ = 0;
          b_23.low = (long)fVar14._0_10_;
          b_23.high = (short)(fVar14._0_10_ >> 0x40);
          fVar12 = floatx80_add_m68k(a_27,b_23,status);
          fVar14 = float64_to_floatx80_m68k(0xbfd5555555555555,status);
          a_28._10_6_ = 0;
          a_28.low = (long)fVar13._0_10_;
          a_28.high = (short)(fVar13._0_10_ >> 0x40);
          b_24._10_6_ = 0;
          b_24.low = (long)fVar14._0_10_;
          b_24.high = (short)(fVar14._0_10_ >> 0x40);
          fVar13 = floatx80_add_m68k(a_28,b_24,status);
          a_29._10_6_ = 0;
          a_29.low = (long)fVar12._0_10_;
          a_29.high = (short)(fVar12._0_10_ >> 0x40);
          b_25._10_6_ = 0;
          b_25.low = (long)Var5;
          b_25.high = (short)(Var5 >> 0x40);
          fVar12 = floatx80_mul_m68k(a_29,b_25,status);
          a_30._10_6_ = 0;
          a_30.low = (long)Var5;
          a_30.high = (short)(Var5 >> 0x40);
          b_26._10_6_ = 0;
          b_26.low = (long)Var4;
          b_26.high = (short)(Var4 >> 0x40);
          fVar14 = floatx80_mul_m68k(a_30,b_26,status);
          a_31._10_6_ = 0;
          a_31.low = (long)fVar13._0_10_;
          a_31.high = (short)(fVar13._0_10_ >> 0x40);
          b_27._10_6_ = 0;
          b_27.low = (long)fVar12._0_10_;
          b_27.high = (short)(fVar12._0_10_ >> 0x40);
          fVar12 = floatx80_add_m68k(a_31,b_27,status);
          a_32._10_6_ = 0;
          a_32.low = (long)fVar14._0_10_;
          a_32.high = (short)(fVar14._0_10_ >> 0x40);
          b_28._10_6_ = 0;
          b_28.low = (long)fVar12._0_10_;
          b_28.high = (short)(fVar12._0_10_ >> 0x40);
          fVar12 = floatx80_mul_m68k(a_32,b_28,status);
          status->float_rounding_mode = cVar1;
          status->floatx80_rounding_precision = cVar2;
          a_33._10_6_ = 0;
          a_33.low = (long)fVar12._0_10_;
          a_33.high = (short)(fVar12._0_10_ >> 0x40);
          b_29._10_6_ = 0;
          b_29.low = (long)Var4;
          b_29.high = (short)(Var4 >> 0x40);
          fVar12 = floatx80_add_m68k(a_33,b_29,status);
          uVar10 = fVar12.high;
          float_raise_m68k(' ',status);
          fVar11._8_8_ = extraout_RDX_02;
          fVar11.low = fVar12.low;
        }
      }
      else if ((int)uVar6 < 0x40638001) {
        fVar12 = packFloatx80('\x01',0x3fff,0x8000000000000000);
        a_03._10_6_ = 0;
        a_03.low = (long)fVar12._0_10_;
        a_03.high = (short)(fVar12._0_10_ >> 0x40);
        b_00._10_6_ = 0;
        b_00.low = (long)Var4;
        b_00.high = (short)(Var4 >> 0x40);
        fVar12 = floatx80_div_m68k(a_03,b_00,status);
        Var4 = fVar12._0_10_;
        a_04._10_6_ = 0;
        a_04.low = (long)Var4;
        a_04.high = (short)(Var4 >> 0x40);
        b_01._10_6_ = 0;
        b_01.low = (long)Var4;
        b_01.high = (short)(Var4 >> 0x40);
        fVar12 = floatx80_mul_m68k(a_04,b_01,status);
        Var5 = fVar12._0_10_;
        a_05._10_6_ = 0;
        a_05.low = (long)Var5;
        a_05.high = (short)(Var5 >> 0x40);
        b_02._10_6_ = 0;
        b_02.low = (long)Var5;
        b_02.high = (short)(Var5 >> 0x40);
        fVar12 = floatx80_mul_m68k(a_05,b_02,status);
        fVar13 = float64_to_floatx80_m68k(0xbfb70bf398539e6a,status);
        fVar14 = float64_to_floatx80_m68k(0x3fbc7187962d1d7d,status);
        Var3 = fVar12._0_10_;
        a_06._10_6_ = 0;
        a_06.low = (long)fVar13._0_10_;
        a_06.high = (short)(fVar13._0_10_ >> 0x40);
        b_03._10_6_ = 0;
        b_03.low = (long)Var3;
        b_03.high = (short)(Var3 >> 0x40);
        fVar12 = floatx80_mul_m68k(a_06,b_03,status);
        a_07._10_6_ = 0;
        a_07.low = (long)fVar14._0_10_;
        a_07.high = (short)(fVar14._0_10_ >> 0x40);
        b_04._10_6_ = 0;
        b_04.low = (long)Var3;
        b_04.high = (short)(Var3 >> 0x40);
        fVar13 = floatx80_mul_m68k(a_07,b_04,status);
        fVar14 = float64_to_floatx80_m68k(0xbfc24924827107b8,status);
        a_08._10_6_ = 0;
        a_08.low = (long)fVar12._0_10_;
        a_08.high = (short)(fVar12._0_10_ >> 0x40);
        b_05._10_6_ = 0;
        b_05.low = (long)fVar14._0_10_;
        b_05.high = (short)(fVar14._0_10_ >> 0x40);
        fVar12 = floatx80_add_m68k(a_08,b_05,status);
        fVar14 = float64_to_floatx80_m68k(0x3fc999999996263e,status);
        a_09._10_6_ = 0;
        a_09.low = (long)fVar13._0_10_;
        a_09.high = (short)(fVar13._0_10_ >> 0x40);
        b_06._10_6_ = 0;
        b_06.low = (long)fVar14._0_10_;
        b_06.high = (short)(fVar14._0_10_ >> 0x40);
        fVar13 = floatx80_add_m68k(a_09,b_06,status);
        a_10._10_6_ = 0;
        a_10.low = (long)Var3;
        a_10.high = (short)(Var3 >> 0x40);
        b_07._10_6_ = 0;
        b_07.low = (long)fVar12._0_10_;
        b_07.high = (short)(fVar12._0_10_ >> 0x40);
        fVar12 = floatx80_mul_m68k(a_10,b_07,status);
        a_11._10_6_ = 0;
        a_11.low = (long)fVar13._0_10_;
        a_11.high = (short)(fVar13._0_10_ >> 0x40);
        b_08._10_6_ = 0;
        b_08.low = (long)Var5;
        b_08.high = (short)(Var5 >> 0x40);
        fVar13 = floatx80_mul_m68k(a_11,b_08,status);
        fVar14 = float64_to_floatx80_m68k(0xbfd5555555555536,status);
        a_12._10_6_ = 0;
        a_12.low = (long)fVar12._0_10_;
        a_12.high = (short)(fVar12._0_10_ >> 0x40);
        b_09._10_6_ = 0;
        b_09.low = (long)fVar14._0_10_;
        b_09.high = (short)(fVar14._0_10_ >> 0x40);
        fVar12 = floatx80_add_m68k(a_12,b_09,status);
        a_13._10_6_ = 0;
        a_13.low = (long)Var5;
        a_13.high = (short)(Var5 >> 0x40);
        b_10._10_6_ = 0;
        b_10.low = (long)Var4;
        b_10.high = (short)(Var4 >> 0x40);
        fVar14 = floatx80_mul_m68k(a_13,b_10,status);
        a_14._10_6_ = 0;
        a_14.low = (long)fVar12._0_10_;
        a_14.high = (short)(fVar12._0_10_ >> 0x40);
        b_11._10_6_ = 0;
        b_11.low = (long)fVar13._0_10_;
        b_11.high = (short)(fVar13._0_10_ >> 0x40);
        fVar12 = floatx80_add_m68k(a_14,b_11,status);
        a_15._10_6_ = 0;
        a_15.low = (long)fVar14._0_10_;
        a_15.high = (short)(fVar14._0_10_ >> 0x40);
        b_12._10_6_ = 0;
        b_12.low = (long)fVar12._0_10_;
        b_12.high = (short)(fVar12._0_10_ >> 0x40);
        fVar12 = floatx80_mul_m68k(a_15,b_12,status);
        a_16._10_6_ = 0;
        a_16.low = (long)fVar12._0_10_;
        a_16.high = (short)(fVar12._0_10_ >> 0x40);
        b_13._10_6_ = 0;
        b_13.low = (long)Var4;
        b_13.high = (short)(Var4 >> 0x40);
        fVar12 = floatx80_add_m68k(a_16,b_13,status);
        fVar13 = packFloatx80(zSign,0x3fff,0xc90fdaa22168c235);
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        a_17._10_6_ = 0;
        a_17.low = (long)fVar12._0_10_;
        a_17.high = (short)(fVar12._0_10_ >> 0x40);
        b_14._10_6_ = 0;
        b_14.low = (long)fVar13._0_10_;
        b_14.high = (short)(fVar13._0_10_ >> 0x40);
        fVar12 = floatx80_add_m68k(a_17,b_14,status);
        uVar10 = fVar12.high;
        float_raise_m68k(' ',status);
        fVar11._8_8_ = extraout_RDX_00;
        fVar11.low = fVar12.low;
      }
      else {
        fVar12 = packFloatx80(zSign,0x3fff,0xc90fdaa22168c235);
        fVar13 = packFloatx80(zSign,1,0x8000000000000000);
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        a_02._10_6_ = 0;
        a_02.low = (long)fVar12._0_10_;
        a_02.high = (short)(fVar12._0_10_ >> 0x40);
        b._10_6_ = 0;
        b.low = (long)fVar13._0_10_;
        b.high = (short)(fVar13._0_10_ >> 0x40);
        fVar12 = floatx80_sub_m68k(a_02,b,status);
        uVar10 = fVar12.high;
        float_raise_m68k(' ',status);
        fVar11._8_8_ = extraout_RDX;
        fVar11.low = fVar12.low;
      }
    }
    else {
      fVar12 = packFloatx80(zSign,aExp_00,uVar8 & 0xf800000000000000 | 0x400000000000000);
      fVar13 = packFloatx80('\0',0x3fff,0x8000000000000000);
      Var3 = fVar12._0_10_;
      a_34._10_6_ = 0;
      a_34.low = (long)Var4;
      a_34.high = (short)(Var4 >> 0x40);
      b_30._10_6_ = 0;
      b_30.low = (long)Var3;
      b_30.high = (short)(Var3 >> 0x40);
      fVar12 = floatx80_mul_m68k(a_34,b_30,status);
      a_35._10_6_ = 0;
      a_35.low = (long)Var4;
      a_35.high = (short)(Var4 >> 0x40);
      b_31._10_6_ = 0;
      b_31.low = (long)Var3;
      b_31.high = (short)(Var3 >> 0x40);
      fVar14 = floatx80_sub_m68k(a_35,b_31,status);
      a_36._10_6_ = 0;
      a_36.low = (long)fVar12._0_10_;
      a_36.high = (short)(fVar12._0_10_ >> 0x40);
      b_32._10_6_ = 0;
      b_32.low = (long)fVar13._0_10_;
      b_32.high = (short)(fVar13._0_10_ >> 0x40);
      fVar12 = floatx80_add_m68k(a_36,b_32,status);
      a_37._10_6_ = 0;
      a_37.low = (long)fVar14._0_10_;
      a_37.high = (short)(fVar14._0_10_ >> 0x40);
      b_33._10_6_ = 0;
      b_33.low = (long)fVar12._0_10_;
      b_33.high = (short)(fVar12._0_10_ >> 0x40);
      fVar12 = floatx80_div_m68k(a_37,b_33,status);
      iVar7 = (int)((uVar6 & 0x7800) + ((int)((uVar6 & 0x7fff0000) + 0xc0050000) >> 1)) >> 0xb;
      uVar8 = atan_tbl[iVar7].low;
      fp3.low._0_2_ = (ushort)*(undefined8 *)&atan_tbl[iVar7].high;
      uVar9 = 0;
      if (zSign != '\0') {
        uVar9 = 0x8000;
      }
      Var3 = fVar12._0_10_;
      a_38._10_6_ = 0;
      a_38.low = (long)Var3;
      a_38.high = (short)(Var3 >> 0x40);
      b_34._10_6_ = 0;
      b_34.low = (long)Var3;
      b_34.high = (short)(Var3 >> 0x40);
      fVar12 = floatx80_mul_m68k(a_38,b_34,status);
      fVar13 = float64_to_floatx80_m68k(0xbff6687e314987d8,status);
      Var4 = fVar12._0_10_;
      a_39._10_6_ = 0;
      a_39.low = (long)fVar13._0_10_;
      a_39.high = (short)(fVar13._0_10_ >> 0x40);
      b_35._10_6_ = 0;
      b_35.low = (long)Var4;
      b_35.high = (short)(Var4 >> 0x40);
      fVar12 = floatx80_add_m68k(a_39,b_35,status);
      a_40._10_6_ = 0;
      a_40.low = (long)fVar12._0_10_;
      a_40.high = (short)(fVar12._0_10_ >> 0x40);
      b_36._10_6_ = 0;
      b_36.low = (long)Var4;
      b_36.high = (short)(Var4 >> 0x40);
      fVar12 = floatx80_mul_m68k(a_40,b_36,status);
      a_41._10_6_ = 0;
      a_41.low = (long)Var4;
      a_41.high = (short)(Var4 >> 0x40);
      b_37._10_6_ = 0;
      b_37.low = (long)Var3;
      b_37.high = (short)(Var3 >> 0x40);
      fVar13 = floatx80_mul_m68k(a_41,b_37,status);
      fVar14 = float64_to_floatx80_m68k(0x4002ac6934a26db3,status);
      a_42._10_6_ = 0;
      a_42.low = (long)fVar12._0_10_;
      a_42.high = (short)(fVar12._0_10_ >> 0x40);
      b_38._10_6_ = 0;
      b_38.low = (long)fVar14._0_10_;
      b_38.high = (short)(fVar14._0_10_ >> 0x40);
      fVar12 = floatx80_add_m68k(a_42,b_38,status);
      fVar14 = float64_to_floatx80_m68k(0xbfc2476f4e1da28e,status);
      a_43._10_6_ = 0;
      a_43.low = (long)fVar13._0_10_;
      a_43.high = (short)(fVar13._0_10_ >> 0x40);
      b_39._10_6_ = 0;
      b_39.low = (long)fVar14._0_10_;
      b_39.high = (short)(fVar14._0_10_ >> 0x40);
      fVar13 = floatx80_mul_m68k(a_43,b_39,status);
      a_44._10_6_ = 0;
      a_44.low = (long)fVar13._0_10_;
      a_44.high = (short)(fVar13._0_10_ >> 0x40);
      b_40._10_6_ = 0;
      b_40.low = (long)fVar12._0_10_;
      b_40.high = (short)(fVar12._0_10_ >> 0x40);
      fVar12 = floatx80_mul_m68k(a_44,b_40,status);
      a_45._10_6_ = 0;
      a_45.low = (long)Var3;
      a_45.high = (short)(Var3 >> 0x40);
      b_41._10_6_ = 0;
      b_41.low = (long)fVar12._0_10_;
      b_41.high = (short)(fVar12._0_10_ >> 0x40);
      fVar12 = floatx80_add_m68k(a_45,b_41,status);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      b_42.high = (ushort)fp3.low | uVar9;
      b_42.low = uVar8;
      a_46._10_6_ = 0;
      a_46.low = (long)fVar12._0_10_;
      a_46.high = (short)(fVar12._0_10_ >> 0x40);
      b_42._10_6_ = 0;
      fVar12 = floatx80_add_m68k(a_46,b_42,status);
      uVar10 = fVar12.high;
      float_raise_m68k(' ',status);
      fVar11._8_8_ = extraout_RDX_03;
      fVar11.low = fVar12.low;
    }
  }
  a_local._8_8_ = fVar11.low;
  fVar15._10_6_ = fVar11._10_6_;
  fVar15.high = uVar10;
  fVar15.low = a_local._8_8_;
  return fVar15;
}

Assistant:

floatx80 floatx80_atan(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact, tbl_index;
    floatx80 fp0, fp1, fp2, fp3, xsave;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        a = packFloatx80(aSign, piby2_exp, pi_sig);
        float_raise(float_flag_inexact, status);
        return floatx80_move(a, status);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    compact = floatx80_make_compact(aExp, aSig);

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    if (compact < 0x3FFB8000 || compact > 0x4002FFFF) {
        /* |X| >= 16 or |X| < 1/16 */
        if (compact > 0x3FFF8000) { /* |X| >= 16 */
            if (compact > 0x40638000) { /* |X| > 2^(100) */
                fp0 = packFloatx80(aSign, piby2_exp, pi_sig);
                fp1 = packFloatx80(aSign, 0x0001, one_sig);

                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_sub(fp0, fp1, status);

                float_raise(float_flag_inexact, status);

                return a;
            } else {
                fp0 = a;
                fp1 = packFloatx80(1, one_exp, one_sig); /* -1 */
                fp1 = floatx80_div(fp1, fp0, status); /* X' = -1/X */
                xsave = fp1;
                fp0 = floatx80_mul(fp1, fp1, status); /* Y = X'*X' */
                fp1 = floatx80_mul(fp0, fp0, status); /* Z = Y*Y */
                fp3 = float64_to_floatx80(make_float64(0xBFB70BF398539E6A),
                                          status); /* C5 */
                fp2 = float64_to_floatx80(make_float64(0x3FBC7187962D1D7D),
                                          status); /* C4 */
                fp3 = floatx80_mul(fp3, fp1, status); /* Z*C5 */
                fp2 = floatx80_mul(fp2, fp1, status); /* Z*C4 */
                fp3 = floatx80_add(fp3, float64_to_floatx80(
                                   make_float64(0xBFC24924827107B8), status),
                                   status); /* C3+Z*C5 */
                fp2 = floatx80_add(fp2, float64_to_floatx80(
                                   make_float64(0x3FC999999996263E), status),
                                   status); /* C2+Z*C4 */
                fp1 = floatx80_mul(fp1, fp3, status); /* Z*(C3+Z*C5) */
                fp2 = floatx80_mul(fp2, fp0, status); /* Y*(C2+Z*C4) */
                fp1 = floatx80_add(fp1, float64_to_floatx80(
                                   make_float64(0xBFD5555555555536), status),
                                   status); /* C1+Z*(C3+Z*C5) */
                fp0 = floatx80_mul(fp0, xsave, status); /* X'*Y */
                /* [Y*(C2+Z*C4)]+[C1+Z*(C3+Z*C5)] */
                fp1 = floatx80_add(fp1, fp2, status);
                /* X'*Y*([B1+Z*(B3+Z*B5)]+[Y*(B2+Z*(B4+Z*B6))]) ?? */
                fp0 = floatx80_mul(fp0, fp1, status);
                fp0 = floatx80_add(fp0, xsave, status);
                fp1 = packFloatx80(aSign, piby2_exp, pi_sig);

                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_add(fp0, fp1, status);

                float_raise(float_flag_inexact, status);

                return a;
            }
        } else { /* |X| < 1/16 */
            if (compact < 0x3FD78000) { /* |X| < 2^(-40) */
                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_move(a, status);

                float_raise(float_flag_inexact, status);

                return a;
            } else {
                fp0 = a;
                xsave = a;
                fp0 = floatx80_mul(fp0, fp0, status); /* Y = X*X */
                fp1 = floatx80_mul(fp0, fp0, status); /* Z = Y*Y */
                fp2 = float64_to_floatx80(make_float64(0x3FB344447F876989),
                                          status); /* B6 */
                fp3 = float64_to_floatx80(make_float64(0xBFB744EE7FAF45DB),
                                          status); /* B5 */
                fp2 = floatx80_mul(fp2, fp1, status); /* Z*B6 */
                fp3 = floatx80_mul(fp3, fp1, status); /* Z*B5 */
                fp2 = floatx80_add(fp2, float64_to_floatx80(
                                   make_float64(0x3FBC71C646940220), status),
                                   status); /* B4+Z*B6 */
                fp3 = floatx80_add(fp3, float64_to_floatx80(
                                   make_float64(0xBFC24924921872F9),
                                   status), status); /* B3+Z*B5 */
                fp2 = floatx80_mul(fp2, fp1, status); /* Z*(B4+Z*B6) */
                fp1 = floatx80_mul(fp1, fp3, status); /* Z*(B3+Z*B5) */
                fp2 = floatx80_add(fp2, float64_to_floatx80(
                                   make_float64(0x3FC9999999998FA9), status),
                                   status); /* B2+Z*(B4+Z*B6) */
                fp1 = floatx80_add(fp1, float64_to_floatx80(
                                   make_float64(0xBFD5555555555555), status),
                                   status); /* B1+Z*(B3+Z*B5) */
                fp2 = floatx80_mul(fp2, fp0, status); /* Y*(B2+Z*(B4+Z*B6)) */
                fp0 = floatx80_mul(fp0, xsave, status); /* X*Y */
                /* [B1+Z*(B3+Z*B5)]+[Y*(B2+Z*(B4+Z*B6))] */
                fp1 = floatx80_add(fp1, fp2, status);
                /* X*Y*([B1+Z*(B3+Z*B5)]+[Y*(B2+Z*(B4+Z*B6))]) */
                fp0 = floatx80_mul(fp0, fp1, status);

                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_add(fp0, xsave, status);

                float_raise(float_flag_inexact, status);

                return a;
            }
        }
    } else {
        aSig &= UINT64_C(0xF800000000000000);
        aSig |= UINT64_C(0x0400000000000000);
        xsave = packFloatx80(aSign, aExp, aSig); /* F */
        fp0 = a;
        fp1 = a; /* X */
        fp2 = packFloatx80(0, one_exp, one_sig); /* 1 */
        fp1 = floatx80_mul(fp1, xsave, status); /* X*F */
        fp0 = floatx80_sub(fp0, xsave, status); /* X-F */
        fp1 = floatx80_add(fp1, fp2, status); /* 1 + X*F */
        fp0 = floatx80_div(fp0, fp1, status); /* U = (X-F)/(1+X*F) */

        tbl_index = compact;

        tbl_index &= 0x7FFF0000;
        tbl_index -= 0x3FFB0000;
        tbl_index >>= 1;
        tbl_index += compact & 0x00007800;
        tbl_index >>= 11;

        fp3 = atan_tbl[tbl_index];

        fp3.high |= aSign ? 0x8000 : 0; /* ATAN(F) */

        fp1 = floatx80_mul(fp0, fp0, status); /* V = U*U */
        fp2 = float64_to_floatx80(make_float64(0xBFF6687E314987D8),
                                  status); /* A3 */
        fp2 = floatx80_add(fp2, fp1, status); /* A3+V */
        fp2 = floatx80_mul(fp2, fp1, status); /* V*(A3+V) */
        fp1 = floatx80_mul(fp1, fp0, status); /* U*V */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0x4002AC6934A26DB3), status),
                           status); /* A2+V*(A3+V) */
        fp1 = floatx80_mul(fp1, float64_to_floatx80(
                           make_float64(0xBFC2476F4E1DA28E), status),
                           status); /* A1+U*V */
        fp1 = floatx80_mul(fp1, fp2, status); /* A1*U*V*(A2+V*(A3+V)) */
        fp0 = floatx80_add(fp0, fp1, status); /* ATAN(U) */

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_add(fp0, fp3, status); /* ATAN(X) */

        float_raise(float_flag_inexact, status);

        return a;
    }
}